

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O0

void __thiscall Refal2::CLeftPartCompiler::matchRightSymbol(CLeftPartCompiler *this)

{
  TUnitType TVar1;
  CNodeType *pCVar2;
  TChar *pTVar3;
  TLabel *pTVar4;
  TNumber *pTVar5;
  undefined1 auStack_38 [8];
  CUnitNode unit;
  CLeftPartCompiler *this_local;
  
  pCVar2 = CNodeList<Refal2::CUnit>::GetLast((CNodeList<Refal2::CUnit> *)this->hole);
  auStack_38._0_4_ = (pCVar2->super_CUnit).type;
  auStack_38._4_4_ = *(undefined4 *)&(pCVar2->super_CUnit).field_0x4;
  unit.super_CUnit._0_8_ = (pCVar2->super_CUnit).field_1;
  unit.super_CUnit.field_1 = (anon_union_8_5_86ac0f1f_for_CUnit_1)pCVar2->prev;
  unit.prev = pCVar2->next;
  TVar1 = CUnit::GetType((CUnit *)auStack_38);
  if (TVar1 == UT_Char) {
    pTVar3 = CUnit::Char((CUnit *)auStack_38);
    COperationsBuilder::AddMatchRightChar((COperationsBuilder *)this,*pTVar3);
  }
  else if (TVar1 == UT_Label) {
    pTVar4 = CUnit::Label((CUnit *)auStack_38);
    COperationsBuilder::AddMatchRightLabel((COperationsBuilder *)this,*pTVar4);
  }
  else {
    if (TVar1 != UT_Number) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/FunctionCompiler.cpp"
                    ,0x1c9,"void Refal2::CLeftPartCompiler::matchRightSymbol()");
    }
    pTVar5 = CUnit::Number((CUnit *)auStack_38);
    COperationsBuilder::AddMatchRightNumber((COperationsBuilder *)this,*pTVar5);
  }
  CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
  return;
}

Assistant:

void CLeftPartCompiler::matchRightSymbol()
{
	CUnitNode unit = *hole->GetLast();
	switch( unit.GetType() ) {
		case UT_Char:
			COperationsBuilder::AddMatchRightChar( unit.Char() );
			break;
		case UT_Label:
			COperationsBuilder::AddMatchRightLabel( unit.Label() );
			break;
		case UT_Number:
			COperationsBuilder::AddMatchRightNumber( unit.Number() );
			break;
		default:
			assert( false );
			break;
	}
	hole->RemoveLast();
}